

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O2

JL_STATUS JlBase64Decode(char *Base64String,void **pData,size_t *pDataSize)

{
  byte bVar1;
  JL_STATUS JVar2;
  uint8_t *Memory;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  size_t NumOfElements;
  uint8_t *ThreeByteBlock;
  ulong uVar7;
  char *FourCharBlock;
  bool bVar8;
  uint8_t byteBlock [3];
  char charBlock [5];
  
  if (pDataSize == (size_t *)0x0 || (pData == (void **)0x0 || Base64String == (char *)0x0)) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  *pData = (void *)0x0;
  *pDataSize = 0;
  uVar6 = 0;
  while( true ) {
    bVar1 = Base64String[uVar6];
    if ((bVar1 == 0) || (bVar1 == 0x3d)) {
      uVar7 = uVar6 >> 2;
      uVar5 = (uint)uVar6;
      uVar3 = (ulong)(uVar5 & 3);
      lVar4 = 0;
      if (uVar3 != 0) {
        lVar4 = uVar3 - 1;
      }
      NumOfElements = lVar4 + uVar7 * 3;
      Memory = (uint8_t *)WjTestLib_Calloc(NumOfElements,1);
      ThreeByteBlock = Memory;
      FourCharBlock = Base64String;
      if (Memory == (uint8_t *)0x0) {
        JVar2 = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
          Decode4Base64ToBytes(FourCharBlock,ThreeByteBlock);
          ThreeByteBlock = ThreeByteBlock + 3;
          FourCharBlock = FourCharBlock + 4;
        }
        if ((uVar5 & 3) < 2) {
          if (uVar3 != 0) {
            WjTestLib_Free(Memory);
            return JL_STATUS_INVALID_DATA;
          }
        }
        else {
          uVar3 = 0;
          builtin_strncpy(charBlock,"AAAA",5);
          byteBlock[2] = '\0';
          byteBlock[0] = '\0';
          byteBlock[1] = '\0';
          for (; (uVar5 & 3) != uVar3; uVar3 = uVar3 + 1) {
            charBlock[uVar3] = Base64String[uVar3 + (uVar6 & 0xfffffffffffffffc)];
          }
          Decode4Base64ToBytes(charBlock,byteBlock);
          for (lVar4 = 0; ((ulong)(uVar5 & 3) - 1) + (ulong)((uVar6 & 3) == 0) != lVar4;
              lVar4 = lVar4 + 1) {
            ThreeByteBlock[lVar4] = byteBlock[lVar4];
          }
        }
        *pData = Memory;
        *pDataSize = NumOfElements;
        JVar2 = JL_STATUS_SUCCESS;
      }
      return JVar2;
    }
    if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x2b && 10 < (byte)(bVar1 - 0x2f)))
    break;
    uVar6 = uVar6 + 1;
  }
  return JL_STATUS_INVALID_DATA;
}

Assistant:

JL_STATUS
    JlBase64Decode
    (
        char const*         Base64String,
        void**              pData,
        size_t*             pDataSize
    )
{
    JL_STATUS jlStatus;
    size_t base64Length = 0;

    if(     NULL != Base64String
        &&  NULL != pData
        &&  NULL != pDataSize )
    {
        *pData = NULL;
        *pDataSize = 0;

        // Get length of string by looking for a zero terminator OR a padding character.
        // Also validate every character is base64
        jlStatus = JL_STATUS_SUCCESS;
        while( 0 != Base64String[base64Length] && '=' != Base64String[base64Length] )
        {
            const char ch = Base64String[base64Length];
            if(     ( ch >= 'A' && ch <= 'Z' )
                ||  ( ch >= 'a' && ch <= 'z' )
                ||  ( ch >= '0' && ch <= '9' )
                ||  ( '+' == ch )
                ||  ( '/' == ch ) )
            {
                base64Length += 1;
            }
            else
            {
                jlStatus = JL_STATUS_INVALID_DATA;
                break;
            }
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            size_t numCompleteBlocks = base64Length / 4;
            size_t numTrailingChars = base64Length % 4;
            size_t numExtraBytes = 0;

            // Calculate size of output
            size_t dataSize = numCompleteBlocks * 3;
            if( numTrailingChars > 0 )
            {
                numExtraBytes = numTrailingChars - 1;
                dataSize += numExtraBytes;
            }

            uint8_t* data = JlAlloc( dataSize );
            if( NULL != data )
            {
                // Process in blocks of 4 characters forming 3 bytes
                size_t outIndex = 0;
                for( size_t blockIndex=0; blockIndex<numCompleteBlocks; blockIndex+=1 )
                {
                    Decode4Base64ToBytes( Base64String + (blockIndex*4), data + outIndex );
                    outIndex += 3;
                }

                if( numExtraBytes > 0 )
                {
                    // Process the final partial block
                    char charBlock[5] = "AAAA";
                    uint8_t byteBlock[3] = {0};
                    for( size_t i=0; i<numTrailingChars; i++ )
                    {
                        charBlock[i] = Base64String[ (numCompleteBlocks*4) + i ];
                    }
                    Decode4Base64ToBytes( charBlock, byteBlock );

                    // Now copy out the required number of bytes
                    for( size_t i=0; i<numExtraBytes; i++ )
                    {
                        data[outIndex] = byteBlock[i];
                        outIndex += 1;
                    }
                }
                else if( numTrailingChars > 0 && 0 == numExtraBytes )
                {
                    // This occurs if there is 1 character in the trailing block. This only represents 6 bits
                    // and therefore not a complete byte, so the data is truncated. So we report this as corrupt
                    jlStatus = JL_STATUS_INVALID_DATA;
                }

                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    *pData = data;
                    *pDataSize = dataSize;
                }
                else
                {
                    JlFree( data );
                }
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}